

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# SimpleDictionaryTypeHandler.cpp
# Opt level: O0

bool __thiscall
Js::SimpleDictionaryTypeHandlerBase<int,Js::PropertyRecord_const*,false>::
TryGetFixedProperty<true,false>
          (SimpleDictionaryTypeHandlerBase<int,Js::PropertyRecord_const*,false> *this,
          PropertyRecord *propertyRecord,Var *pProperty,FixedPropertyKind propertyType,
          ScriptContext *requestContext)

{
  code *pcVar1;
  bool bVar2;
  PropertyId propertyId;
  BOOL BVar3;
  RecyclerWeakReference<Js::DynamicObject> **ppRVar4;
  RecyclerWeakReference<Js::DynamicObject> *this_00;
  ScriptContext *pSVar5;
  BaseDictionary<const_Js::PropertyRecord_*,_Js::SimpleDictionaryPropertyDescriptor<int>,_Memory::RecyclerNonLeafAllocator,_DictionarySizePolicy<PowerOf2Policy,_1U,_2U,_1U,_4U>,_Js::PropertyRecordStringHashComparer,_Js::PropertyMapKeyTraits<const_Js::PropertyRecord_*>::Entry,_JsUtil::NoResizeLock>
  *this_01;
  undefined4 *puVar6;
  Var aValue;
  DynamicObject *local_60;
  Var value;
  SimpleDictionaryPropertyDescriptor<int> *descriptor;
  DynamicObject *localSingletonInstance;
  ScriptContext *requestContext_local;
  Var *ppvStack_28;
  FixedPropertyKind propertyType_local;
  Var *pProperty_local;
  PropertyRecord *propertyRecord_local;
  SimpleDictionaryTypeHandlerBase<int,_const_Js::PropertyRecord_*,_false> *this_local;
  
  localSingletonInstance = (DynamicObject *)requestContext;
  requestContext_local._7_1_ = propertyType;
  ppvStack_28 = pProperty;
  pProperty_local = (Var *)propertyRecord;
  propertyRecord_local = (PropertyRecord *)this;
  ppRVar4 = Memory::WriteBarrierPtr::operator_cast_to_RecyclerWeakReference__
                      ((WriteBarrierPtr *)(this + 0x20));
  if (*ppRVar4 == (RecyclerWeakReference<Js::DynamicObject> *)0x0) {
    local_60 = (DynamicObject *)0x0;
  }
  else {
    this_00 = Memory::WriteBarrierPtr<Memory::RecyclerWeakReference<Js::DynamicObject>_>::operator->
                        ((WriteBarrierPtr<Memory::RecyclerWeakReference<Js::DynamicObject>_> *)
                         (this + 0x20));
    local_60 = Memory::RecyclerWeakReference<Js::DynamicObject>::Get(this_00);
  }
  descriptor = (SimpleDictionaryPropertyDescriptor<int> *)local_60;
  if ((local_60 != (DynamicObject *)0x0) &&
     (pSVar5 = RecyclableObject::GetScriptContext(&local_60->super_RecyclableObject),
     pSVar5 == (ScriptContext *)localSingletonInstance)) {
    this_01 = Memory::
              WriteBarrierPtr<JsUtil::BaseDictionary<const_Js::PropertyRecord_*,_Js::SimpleDictionaryPropertyDescriptor<int>,_Memory::RecyclerNonLeafAllocator,_DictionarySizePolicy<PowerOf2Policy,_1U,_2U,_1U,_4U>,_Js::PropertyRecordStringHashComparer,_Js::PropertyMapKeyTraits<const_Js::PropertyRecord_*>::Entry,_JsUtil::NoResizeLock>_>
              ::operator->((WriteBarrierPtr<JsUtil::BaseDictionary<const_Js::PropertyRecord_*,_Js::SimpleDictionaryPropertyDescriptor<int>,_Memory::RecyclerNonLeafAllocator,_DictionarySizePolicy<PowerOf2Policy,_1U,_2U,_1U,_4U>,_Js::PropertyRecordStringHashComparer,_Js::PropertyMapKeyTraits<const_Js::PropertyRecord_*>::Entry,_JsUtil::NoResizeLock>_>
                            *)(this + 0x18));
    bVar2 = JsUtil::
            BaseDictionary<Js::PropertyRecord_const*,Js::SimpleDictionaryPropertyDescriptor<int>,Memory::RecyclerNonLeafAllocator,DictionarySizePolicy<PowerOf2Policy,1u,2u,1u,4u>,Js::PropertyRecordStringHashComparer,Js::PropertyMapKeyTraits<Js::PropertyRecord_const*>::Entry,JsUtil::NoResizeLock>
            ::TryGetReference<Js::PropertyRecord_const*>
                      ((BaseDictionary<Js::PropertyRecord_const*,Js::SimpleDictionaryPropertyDescriptor<int>,Memory::RecyclerNonLeafAllocator,DictionarySizePolicy<PowerOf2Policy,1u,2u,1u,4u>,Js::PropertyRecordStringHashComparer,Js::PropertyMapKeyTraits<Js::PropertyRecord_const*>::Entry,JsUtil::NoResizeLock>
                        *)this_01,(PropertyRecord **)&pProperty_local,
                       (SimpleDictionaryPropertyDescriptor<int> **)&value);
    if ((bVar2) && ((*value >> 2 & 1) != 0)) {
      if ((*(byte *)((long)value + 1) & 0x10) != 0) {
        AssertCount = AssertCount + 1;
        Throw::LogAssert();
        puVar6 = (undefined4 *)__tls_get_addr(&PTR_01e57ed8);
        *puVar6 = 1;
        bVar2 = Throw::ReportAssert("/workspace/llm4binary/github/license_c_cmakelists/chakra-core[P]ChakraCore/lib/Runtime/Types/SimpleDictionaryTypeHandler.cpp"
                                    ,0xc6b,"(!(descriptor->Attributes & 0x10))",
                                    "can\'t have fixed global let/const");
        if (!bVar2) {
          pcVar1 = (code *)invalidInstructionException();
          (*pcVar1)();
        }
        puVar6 = (undefined4 *)__tls_get_addr(&PTR_01e57ed8);
        *puVar6 = 0;
      }
      propertyId = PropertyRecord::GetPropertyId((PropertyRecord *)pProperty_local);
      BVar3 = IsInternalPropertyId(propertyId);
      if (BVar3 != 0) {
        AssertCount = AssertCount + 1;
        Throw::LogAssert();
        puVar6 = (undefined4 *)__tls_get_addr(&PTR_01e57ed8);
        *puVar6 = 1;
        bVar2 = Throw::ReportAssert("/workspace/llm4binary/github/license_c_cmakelists/chakra-core[P]ChakraCore/lib/Runtime/Types/SimpleDictionaryTypeHandler.cpp"
                                    ,0xc6c,
                                    "(!IsInternalPropertyId(propertyRecord->GetPropertyId()))",
                                    "!IsInternalPropertyId(propertyRecord->GetPropertyId())");
        if (!bVar2) {
          pcVar1 = (code *)invalidInstructionException();
          (*pcVar1)();
        }
        puVar6 = (undefined4 *)__tls_get_addr(&PTR_01e57ed8);
        *puVar6 = 0;
      }
      aValue = DynamicObject::GetSlot((DynamicObject *)descriptor,*(int *)((long)value + 4));
      if ((aValue != (Var)0x0) &&
         (((bVar2 = DynamicTypeHandler::IsFixedMethodProperty
                              ((DynamicTypeHandler *)this,requestContext_local._7_1_), bVar2 &&
           (bVar2 = VarIs<Js::JavascriptFunction>(aValue), bVar2)) ||
          (bVar2 = DynamicTypeHandler::IsFixedDataProperty
                             ((DynamicTypeHandler *)this,requestContext_local._7_1_), bVar2)))) {
        *ppvStack_28 = aValue;
        return true;
      }
    }
  }
  return false;
}

Assistant:

bool SimpleDictionaryTypeHandlerBase<TPropertyIndex, TMapKey, IsNotExtensibleSupported>::TryGetFixedProperty(PropertyRecord const * propertyRecord, Var * pProperty, FixedPropertyKind propertyType, ScriptContext * requestContext)
    {
        // Note: This function is not thread-safe and cannot be called from the JIT thread.  That's why we collect and
        // cache any fixed function instances during work item creation on the main thread.
        DynamicObject* localSingletonInstance = this->singletonInstance != nullptr ? this->singletonInstance->Get() : nullptr;
        if (localSingletonInstance != nullptr && localSingletonInstance->GetScriptContext() == requestContext)
        {
            SimpleDictionaryPropertyDescriptor<TPropertyIndex>* descriptor;
            if (propertyMap->TryGetReference(propertyRecord, &descriptor))
            {
                if (descriptor->isFixed)
                {
                    AssertMsg(!(descriptor->Attributes & PropertyLetConstGlobal), "can't have fixed global let/const");
                    Assert(!IsInternalPropertyId(propertyRecord->GetPropertyId()));
                    Var value = localSingletonInstance->GetSlot(descriptor->propertyIndex);
                    if (value && ((IsFixedMethodProperty(propertyType) && VarIs<JavascriptFunction>(value)) || IsFixedDataProperty(propertyType)))
                    {
                        *pProperty = value;
                        if (markAsUsed)
                        {
                            descriptor->usedAsFixed = true;
                        }
                        return true;
                    }
                }
            }
            else
            {
                // If we're unordered, we may have removed this descriptor from the map and replaced it with a descriptor for a
                // different property. When we do that, we change the type of the instance, but the old type (which may still be
                // in some inline cache) still points to the same type handler.
                AssertMsg(allowNonExistent || isUnordered, "Trying to get a fixed function instance for a non-existent property?");
            }
        }

        return false;
    }